

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_json_schema.cpp
# Opt level: O2

bool __thiscall flatbuffers::jsons::JsonSchemaGenerator::generate(JsonSchemaGenerator *this)

{
  string *psVar1;
  BaseType BVar2;
  FieldDef *pFVar3;
  bool bVar4;
  EnumDef *pEVar5;
  Parser *pPVar6;
  EnumVal *pEVar7;
  BaseType type;
  StructDef *pSVar8;
  pointer ppEVar9;
  JsonSchemaGenerator *this_00;
  pointer ppFVar10;
  pointer ppEVar11;
  string *psVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> enumdef;
  string local_260;
  string local_240;
  JsonSchemaGenerator *local_220;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> requiredProperties;
  string comment;
  string typeLine;
  string arrayInfo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string *local_170;
  pointer local_168;
  StructDef *local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  StructDef *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  psVar1 = &this->code_;
  std::__cxx11::string::assign((char *)psVar1);
  pSVar8 = ((this->super_BaseGenerator).parser_)->root_struct_def_;
  if (pSVar8 == (StructDef *)0x0) {
    std::operator<<((ostream *)&std::cerr,
                    "Error: Binary schema not generated, no root struct found\n");
  }
  else {
    local_138 = pSVar8;
    NewLine_abi_cxx11_(&local_240,this);
    std::operator+(&enumdef,"{",&local_240);
    std::__cxx11::string::append((string *)psVar1);
    std::__cxx11::string::~string((string *)&enumdef);
    std::__cxx11::string::~string((string *)&local_240);
    Indent_abi_cxx11_(&local_260,this,1);
    std::operator+(&local_240,&local_260,
                   "\"$schema\": \"https://json-schema.org/draft/2019-09/schema\",");
    NewLine_abi_cxx11_(&comment,this);
    std::operator+(&enumdef,&local_240,&comment);
    std::__cxx11::string::append((string *)psVar1);
    std::__cxx11::string::~string((string *)&enumdef);
    std::__cxx11::string::~string((string *)&comment);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    Indent_abi_cxx11_(&local_260,this,1);
    std::operator+(&local_240,&local_260,"\"definitions\": {");
    NewLine_abi_cxx11_(&comment,this);
    std::operator+(&enumdef,&local_240,&comment);
    local_170 = (string *)psVar1;
    std::__cxx11::string::append((string *)psVar1);
    std::__cxx11::string::~string((string *)&enumdef);
    std::__cxx11::string::~string((string *)&comment);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    pPVar6 = (this->super_BaseGenerator).parser_;
    local_220 = this;
    for (ppEVar9 = (pPVar6->enums_).vec.
                   super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppEVar9 !=
        (pPVar6->enums_).vec.
        super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppEVar9 = ppEVar9 + 1) {
      Indent_abi_cxx11_(&arrayInfo,local_220,2);
      std::operator+(&comment,&arrayInfo,"\"");
      anon_unknown_1::GenFullName<flatbuffers::EnumDef>((string *)&requiredProperties,*ppEVar9);
      std::operator+(&local_260,&comment,(string *)&requiredProperties);
      std::operator+(&local_240,&local_260,"\" : {");
      NewLine_abi_cxx11_(&typeLine,local_220);
      std::operator+(&enumdef,&local_240,&typeLine);
      std::__cxx11::string::append(local_170);
      std::__cxx11::string::~string((string *)&enumdef);
      std::__cxx11::string::~string((string *)&typeLine);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&requiredProperties);
      std::__cxx11::string::~string((string *)&comment);
      std::__cxx11::string::~string((string *)&arrayInfo);
      Indent_abi_cxx11_(&comment,local_220,3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&requiredProperties,"string",(allocator<char> *)&local_190);
      anon_unknown_1::GenType(&arrayInfo,(string *)&requiredProperties);
      std::operator+(&local_260,&comment,&arrayInfo);
      std::operator+(&local_240,&local_260,",");
      NewLine_abi_cxx11_(&typeLine,local_220);
      std::operator+(&enumdef,&local_240,&typeLine);
      std::__cxx11::string::append(local_170);
      std::__cxx11::string::~string((string *)&enumdef);
      std::__cxx11::string::~string((string *)&typeLine);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&arrayInfo);
      std::__cxx11::string::~string((string *)&requiredProperties);
      std::__cxx11::string::~string((string *)&comment);
      Indent_abi_cxx11_(&local_240,local_220,3);
      std::operator+(&enumdef,&local_240,"\"enum\": [");
      std::__cxx11::string::~string((string *)&local_240);
      pEVar5 = *ppEVar9;
      for (ppEVar11 = (pEVar5->vals).vec.
                      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          ppEVar11 !=
          (pEVar5->vals).vec.
          super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppEVar11 = ppEVar11 + 1) {
        std::operator+(&local_260,"\"",&(*ppEVar11)->name);
        std::operator+(&local_240,&local_260,"\"");
        std::__cxx11::string::append((string *)&enumdef);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_260);
        pEVar5 = *ppEVar9;
        if (*ppEVar11 !=
            (pEVar5->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1]) {
          std::__cxx11::string::append((char *)&enumdef);
          pEVar5 = *ppEVar9;
        }
      }
      std::__cxx11::string::append((char *)&enumdef);
      NewLine_abi_cxx11_(&local_260,local_220);
      std::operator+(&local_240,&enumdef,&local_260);
      std::__cxx11::string::append(local_170);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      Indent_abi_cxx11_(&comment,local_220,2);
      std::operator+(&local_260,&comment,"},");
      NewLine_abi_cxx11_(&arrayInfo,local_220);
      std::operator+(&local_240,&local_260,&arrayInfo);
      std::__cxx11::string::append(local_170);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&arrayInfo);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&comment);
      std::__cxx11::string::~string((string *)&enumdef);
      pPVar6 = (local_220->super_BaseGenerator).parser_;
    }
    this_00 = local_220;
    psVar12 = local_170;
    for (local_168 = (pPVar6->structs_).vec.
                     super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        local_168 !=
        (pPVar6->structs_).vec.
        super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; local_168 = local_168 + 1) {
      Indent_abi_cxx11_(&arrayInfo,this_00,2);
      std::operator+(&comment,&arrayInfo,"\"");
      anon_unknown_1::GenFullName<flatbuffers::StructDef>((string *)&requiredProperties,*local_168);
      std::operator+(&local_260,&comment,(string *)&requiredProperties);
      std::operator+(&local_240,&local_260,"\" : {");
      NewLine_abi_cxx11_(&typeLine,this_00);
      std::operator+(&enumdef,&local_240,&typeLine);
      std::__cxx11::string::append(psVar12);
      std::__cxx11::string::~string((string *)&enumdef);
      std::__cxx11::string::~string((string *)&typeLine);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&requiredProperties);
      std::__cxx11::string::~string((string *)&comment);
      std::__cxx11::string::~string((string *)&arrayInfo);
      Indent_abi_cxx11_(&comment,this_00,3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&requiredProperties,"object",(allocator<char> *)&local_190);
      anon_unknown_1::GenType(&arrayInfo,(string *)&requiredProperties);
      std::operator+(&local_260,&comment,&arrayInfo);
      std::operator+(&local_240,&local_260,",");
      NewLine_abi_cxx11_(&typeLine,this_00);
      std::operator+(&enumdef,&local_240,&typeLine);
      std::__cxx11::string::append(psVar12);
      std::__cxx11::string::~string((string *)&enumdef);
      std::__cxx11::string::~string((string *)&typeLine);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&arrayInfo);
      std::__cxx11::string::~string((string *)&requiredProperties);
      std::__cxx11::string::~string((string *)&comment);
      PrepareDescription(&comment,this_00,&((*local_168)->super_Definition).doc_comment);
      bVar4 = std::operator!=(&comment,"");
      if (bVar4) {
        Indent_abi_cxx11_((string *)&requiredProperties,this_00,3);
        std::operator+(&arrayInfo,(string *)&requiredProperties,"\"description\" : ");
        std::operator+(&local_260,&arrayInfo,&comment);
        std::operator+(&local_240,&local_260,",");
        NewLine_abi_cxx11_(&typeLine,this_00);
        std::operator+(&enumdef,&local_240,&typeLine);
        std::__cxx11::string::append(psVar12);
        std::__cxx11::string::~string((string *)&enumdef);
        std::__cxx11::string::~string((string *)&typeLine);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::~string((string *)&arrayInfo);
        std::__cxx11::string::~string((string *)&requiredProperties);
      }
      Indent_abi_cxx11_(&local_260,this_00,3);
      std::operator+(&local_240,&local_260,"\"properties\" : {");
      NewLine_abi_cxx11_(&arrayInfo,this_00);
      std::operator+(&enumdef,&local_240,&arrayInfo);
      std::__cxx11::string::append(psVar12);
      std::__cxx11::string::~string((string *)&enumdef);
      std::__cxx11::string::~string((string *)&arrayInfo);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      local_160 = *local_168;
      for (ppFVar10 = (local_160->fields).vec.
                      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          ppFVar10 !=
          (local_160->fields).vec.
          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppFVar10 = ppFVar10 + 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&arrayInfo,"",(allocator<char> *)&enumdef);
        if (((*ppFVar10)->value).type.base_type == BASE_TYPE_ARRAY) {
          NewLine_abi_cxx11_(&local_70,this_00);
          std::operator+(&local_130,",",&local_70);
          Indent_abi_cxx11_(&local_90,this_00,8);
          std::operator+(&local_110,&local_130,&local_90);
          std::operator+(&local_158,&local_110,"\"minItems\": ");
          NumToString<unsigned_short>(&local_b0,((*ppFVar10)->value).type.fixed_length);
          std::operator+(&local_190,&local_158,&local_b0);
          std::operator+(&typeLine,&local_190,",");
          NewLine_abi_cxx11_(&local_d0,this_00);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &requiredProperties,&typeLine,&local_d0);
          Indent_abi_cxx11_(&local_f0,this_00,8);
          std::operator+(&local_260,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &requiredProperties,&local_f0);
          std::operator+(&local_240,&local_260,"\"maxItems\": ");
          NumToString<unsigned_short>(&local_50,((*ppFVar10)->value).type.fixed_length);
          std::operator+(&enumdef,&local_240,&local_50);
          std::__cxx11::string::operator=((string *)&arrayInfo,(string *)&enumdef);
          std::__cxx11::string::~string((string *)&enumdef);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_240);
          std::__cxx11::string::~string((string *)&local_260);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&requiredProperties);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&typeLine);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_158);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&local_70);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&requiredProperties,"",(allocator<char> *)&enumdef);
        if ((*ppFVar10)->deprecated == true) {
          NewLine_abi_cxx11_(&typeLine,this_00);
          std::operator+(&local_260,",",&typeLine);
          Indent_abi_cxx11_(&local_190,this_00,8);
          std::operator+(&local_240,&local_260,&local_190);
          std::operator+(&enumdef,&local_240,"\"deprecated\" : true");
          std::__cxx11::string::operator=((string *)&requiredProperties,(string *)&enumdef);
          std::__cxx11::string::~string((string *)&enumdef);
          std::__cxx11::string::~string((string *)&local_240);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&local_260);
          std::__cxx11::string::~string((string *)&typeLine);
        }
        Indent_abi_cxx11_(&local_260,this_00,4);
        std::operator+(&local_240,&local_260,"\"");
        std::operator+(&enumdef,&local_240,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       *ppFVar10);
        std::operator+(&typeLine,&enumdef,"\"");
        std::__cxx11::string::~string((string *)&enumdef);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_260);
        NewLine_abi_cxx11_(&local_260,this_00);
        std::operator+(&local_240," : {",&local_260);
        Indent_abi_cxx11_(&local_190,this_00,8);
        std::operator+(&enumdef,&local_240,&local_190);
        std::__cxx11::string::append((string *)&typeLine);
        std::__cxx11::string::~string((string *)&enumdef);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_260);
        pFVar3 = *ppFVar10;
        BVar2 = (pFVar3->value).type.base_type;
        switch(BVar2) {
        case BASE_TYPE_VECTOR:
        case BASE_TYPE_ARRAY:
          enumdef._M_dataplus._M_p = (pointer)&enumdef.field_2;
          enumdef._M_string_length = 0;
          enumdef.field_2._M_local_buf[0] = '\0';
          pSVar8 = (pFVar3->value).type.struct_def;
          if (pSVar8 == (StructDef *)0x0) {
            pEVar5 = (pFVar3->value).type.enum_def;
            if (pEVar5 == (EnumDef *)0x0) {
              (anonymous_namespace)::GenType_abi_cxx11_
                        (&local_240,(_anonymous_namespace_ *)(ulong)(pFVar3->value).type.element,
                         type);
            }
            else {
              anon_unknown_1::GenTypeRef<flatbuffers::EnumDef>(&local_240,pEVar5);
            }
          }
          else {
            anon_unknown_1::GenTypeRef<flatbuffers::StructDef>(&local_240,pSVar8);
          }
          std::__cxx11::string::operator=((string *)&enumdef,(string *)&local_240);
          std::__cxx11::string::~string((string *)&local_240);
          std::operator+(&local_240,"\"type\" : \"array\", \"items\" : {",&enumdef);
          std::operator+(&local_190,&local_240,"}");
          std::__cxx11::string::~string((string *)&local_240);
          std::__cxx11::string::~string((string *)&enumdef);
          break;
        case BASE_TYPE_STRUCT:
          anon_unknown_1::GenTypeRef<flatbuffers::StructDef>
                    (&local_190,(pFVar3->value).type.struct_def);
          break;
        case BASE_TYPE_UNION:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_190,"\"anyOf\": [",(allocator<char> *)&enumdef);
          pEVar5 = (pFVar3->value).type.enum_def;
          for (ppEVar11 = (pEVar5->vals).vec.
                          super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              ppEVar11 <
              (pEVar5->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_finish; ppEVar11 = ppEVar11 + 1) {
            pEVar7 = *ppEVar11;
            BVar2 = (pEVar7->union_type).base_type;
            if (BVar2 != BASE_TYPE_NONE) {
              if (BVar2 == BASE_TYPE_STRUCT) {
                anon_unknown_1::GenTypeRef<flatbuffers::StructDef>
                          (&local_260,(pEVar7->union_type).struct_def);
                std::operator+(&local_240,"{ ",&local_260);
                std::operator+(&enumdef,&local_240," }");
                std::__cxx11::string::append((string *)&local_190);
                std::__cxx11::string::~string((string *)&enumdef);
                std::__cxx11::string::~string((string *)&local_240);
                std::__cxx11::string::~string((string *)&local_260);
                pEVar7 = *ppEVar11;
              }
              if (pEVar7 != (((pFVar3->value).type.enum_def)->vals).vec.
                            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1]) {
                std::__cxx11::string::append((char *)&local_190);
              }
            }
          }
          std::__cxx11::string::append((char *)&local_190);
          this_00 = local_220;
          psVar12 = local_170;
          break;
        default:
          if (BVar2 == BASE_TYPE_UTYPE) {
            anon_unknown_1::GenTypeRef<flatbuffers::EnumDef>
                      (&local_190,(pFVar3->value).type.enum_def);
          }
          else {
            pSVar8 = (pFVar3->value).type.struct_def;
            if (pSVar8 == (StructDef *)0x0) {
              pEVar5 = (pFVar3->value).type.enum_def;
              if (pEVar5 == (EnumDef *)0x0) {
                (anonymous_namespace)::GenType_abi_cxx11_
                          (&local_190,(_anonymous_namespace_ *)(ulong)BVar2,type);
              }
              else {
                anon_unknown_1::GenTypeRef<flatbuffers::EnumDef>(&local_190,pEVar5);
              }
            }
            else {
              anon_unknown_1::GenTypeRef<flatbuffers::StructDef>(&local_190,pSVar8);
            }
          }
        }
        std::__cxx11::string::append((string *)&typeLine);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::append((string *)&typeLine);
        std::__cxx11::string::append((string *)&typeLine);
        PrepareDescription(&enumdef,this_00,&((*ppFVar10)->super_Definition).doc_comment);
        bVar4 = std::operator!=(&enumdef,"");
        if (bVar4) {
          NewLine_abi_cxx11_(&local_110,this_00);
          std::operator+(&local_158,",",&local_110);
          Indent_abi_cxx11_(&local_130,this_00,8);
          std::operator+(&local_190,&local_158,&local_130);
          std::operator+(&local_260,&local_190,"\"description\" : ");
          std::operator+(&local_240,&local_260,&enumdef);
          std::__cxx11::string::append((string *)&typeLine);
          std::__cxx11::string::~string((string *)&local_240);
          std::__cxx11::string::~string((string *)&local_260);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&local_158);
          std::__cxx11::string::~string((string *)&local_110);
        }
        NewLine_abi_cxx11_(&local_190,this_00);
        Indent_abi_cxx11_(&local_158,this_00,7);
        std::operator+(&local_260,&local_190,&local_158);
        std::operator+(&local_240,&local_260,"}");
        std::__cxx11::string::append((string *)&typeLine);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_190);
        if (*ppFVar10 !=
            (local_160->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1]) {
          std::__cxx11::string::append((char *)&typeLine);
        }
        NewLine_abi_cxx11_(&local_260,this_00);
        std::operator+(&local_240,&typeLine,&local_260);
        std::__cxx11::string::append(psVar12);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::~string((string *)&enumdef);
        std::__cxx11::string::~string((string *)&typeLine);
        std::__cxx11::string::~string((string *)&requiredProperties);
        std::__cxx11::string::~string((string *)&arrayInfo);
      }
      Indent_abi_cxx11_(&local_260,this_00,3);
      std::operator+(&local_240,&local_260,"},");
      NewLine_abi_cxx11_(&arrayInfo,this_00);
      std::operator+(&enumdef,&local_240,&arrayInfo);
      std::__cxx11::string::append(psVar12);
      std::__cxx11::string::~string((string *)&enumdef);
      std::__cxx11::string::~string((string *)&arrayInfo);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      requiredProperties.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      requiredProperties.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      requiredProperties.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      copy_if<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef*const*,std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>>,std::back_insert_iterator<std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>>,flatbuffers::jsons::JsonSchemaGenerator::generate()::_lambda(flatbuffers::FieldDef_const*)_1_>
                ((local_160->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (local_160->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&requiredProperties);
      if (requiredProperties.
          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          requiredProperties.
          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        Indent_abi_cxx11_(&local_240,this_00,3);
        std::operator+(&enumdef,&local_240,"\"required\" : [");
        std::__cxx11::string::~string((string *)&local_240);
        for (ppFVar10 = requiredProperties.
                        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            ppFVar10 !=
            requiredProperties.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish; ppFVar10 = ppFVar10 + 1) {
          std::operator+(&local_260,"\"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         *ppFVar10);
          std::operator+(&local_240,&local_260,"\"");
          std::__cxx11::string::append((string *)&enumdef);
          std::__cxx11::string::~string((string *)&local_240);
          std::__cxx11::string::~string((string *)&local_260);
          if (*ppFVar10 !=
              requiredProperties.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish[-1]) {
            std::__cxx11::string::append((char *)&enumdef);
          }
        }
        std::__cxx11::string::append((char *)&enumdef);
        NewLine_abi_cxx11_(&local_260,this_00);
        std::operator+(&local_240,&enumdef,&local_260);
        std::__cxx11::string::append(psVar12);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::~string((string *)&enumdef);
      }
      Indent_abi_cxx11_(&local_260,this_00,3);
      std::operator+(&local_240,&local_260,"\"additionalProperties\" : false");
      NewLine_abi_cxx11_(&arrayInfo,this_00);
      std::operator+(&enumdef,&local_240,&arrayInfo);
      std::__cxx11::string::append(psVar12);
      std::__cxx11::string::~string((string *)&enumdef);
      std::__cxx11::string::~string((string *)&arrayInfo);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      Indent_abi_cxx11_(&local_240,this_00,2);
      std::operator+(&enumdef,&local_240,"}");
      std::__cxx11::string::~string((string *)&local_240);
      if (*local_168 !=
          (((this_00->super_BaseGenerator).parser_)->structs_).vec.
          super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1]) {
        std::__cxx11::string::append((char *)&enumdef);
      }
      NewLine_abi_cxx11_(&local_260,this_00);
      std::operator+(&local_240,&enumdef,&local_260);
      std::__cxx11::string::append(psVar12);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&enumdef);
      std::_Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
      ~_Vector_base(&requiredProperties.
                     super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   );
      std::__cxx11::string::~string((string *)&comment);
      pPVar6 = (this_00->super_BaseGenerator).parser_;
    }
    Indent_abi_cxx11_(&local_260,this_00,1);
    std::operator+(&local_240,&local_260,"},");
    NewLine_abi_cxx11_(&comment,this_00);
    std::operator+(&enumdef,&local_240,&comment);
    std::__cxx11::string::append(psVar12);
    std::__cxx11::string::~string((string *)&enumdef);
    std::__cxx11::string::~string((string *)&comment);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    Indent_abi_cxx11_(&arrayInfo,this_00,1);
    std::operator+(&comment,&arrayInfo,"\"$ref\" : \"#/definitions/");
    anon_unknown_1::GenFullName<flatbuffers::StructDef>
              ((string *)&requiredProperties,
               ((this_00->super_BaseGenerator).parser_)->root_struct_def_);
    std::operator+(&local_260,&comment,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &requiredProperties);
    std::operator+(&local_240,&local_260,"\"");
    NewLine_abi_cxx11_(&typeLine,this_00);
    std::operator+(&enumdef,&local_240,&typeLine);
    std::__cxx11::string::append(psVar12);
    std::__cxx11::string::~string((string *)&enumdef);
    std::__cxx11::string::~string((string *)&typeLine);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&requiredProperties);
    std::__cxx11::string::~string((string *)&comment);
    std::__cxx11::string::~string((string *)&arrayInfo);
    NewLine_abi_cxx11_(&local_240,this_00);
    std::operator+(&enumdef,"}",&local_240);
    std::__cxx11::string::append(psVar12);
    pSVar8 = local_138;
    std::__cxx11::string::~string((string *)&enumdef);
    std::__cxx11::string::~string((string *)&local_240);
  }
  return pSVar8 != (StructDef *)0x0;
}

Assistant:

bool generate() {
    code_ = "";
    if (parser_.root_struct_def_ == nullptr) {
      std::cerr << "Error: Binary schema not generated, no root struct found\n";
      return false;
    }
    code_ += "{" + NewLine();
    code_ += Indent(1) +
             "\"$schema\": \"https://json-schema.org/draft/2019-09/schema\"," +
             NewLine();
    code_ += Indent(1) + "\"definitions\": {" + NewLine();
    for (auto e = parser_.enums_.vec.cbegin(); e != parser_.enums_.vec.cend();
         ++e) {
      code_ += Indent(2) + "\"" + GenFullName(*e) + "\" : {" + NewLine();
      code_ += Indent(3) + GenType("string") + "," + NewLine();
      auto enumdef(Indent(3) + "\"enum\": [");
      for (auto enum_value = (*e)->Vals().begin();
           enum_value != (*e)->Vals().end(); ++enum_value) {
        enumdef.append("\"" + (*enum_value)->name + "\"");
        if (*enum_value != (*e)->Vals().back()) { enumdef.append(", "); }
      }
      enumdef.append("]");
      code_ += enumdef + NewLine();
      code_ += Indent(2) + "}," + NewLine();  // close type
    }
    for (auto s = parser_.structs_.vec.cbegin();
         s != parser_.structs_.vec.cend(); ++s) {
      const auto &structure = *s;
      code_ += Indent(2) + "\"" + GenFullName(structure) + "\" : {" + NewLine();
      code_ += Indent(3) + GenType("object") + "," + NewLine();
      const auto &comment_lines = structure->doc_comment;
      auto comment = PrepareDescription(comment_lines);
      if (comment != "") {
        code_ += Indent(3) + "\"description\" : " + comment + "," + NewLine();
      }

      code_ += Indent(3) + "\"properties\" : {" + NewLine();

      const auto &properties = structure->fields.vec;
      for (auto prop = properties.cbegin(); prop != properties.cend(); ++prop) {
        const auto &property = *prop;
        std::string arrayInfo = "";
        if (IsArray(property->value.type)) {
          arrayInfo = "," + NewLine() + Indent(8) + "\"minItems\": " +
                      NumToString(property->value.type.fixed_length) + "," +
                      NewLine() + Indent(8) + "\"maxItems\": " +
                      NumToString(property->value.type.fixed_length);
        }
        std::string deprecated_info = "";
        if (property->deprecated) {
          deprecated_info =
              "," + NewLine() + Indent(8) + "\"deprecated\" : true";
        }
        std::string typeLine = Indent(4) + "\"" + property->name + "\"";
        typeLine += " : {" + NewLine() + Indent(8);
        typeLine += GenType(property->value.type);
        typeLine += arrayInfo;
        typeLine += deprecated_info;
        auto description = PrepareDescription(property->doc_comment);
        if (description != "") {
          typeLine +=
              "," + NewLine() + Indent(8) + "\"description\" : " + description;
        }

        typeLine += NewLine() + Indent(7) + "}";
        if (property != properties.back()) { typeLine.append(","); }
        code_ += typeLine + NewLine();
      }
      code_ += Indent(3) + "}," + NewLine();  // close properties

      std::vector<FieldDef *> requiredProperties;
      std::copy_if(properties.begin(), properties.end(),
                   back_inserter(requiredProperties),
                   [](FieldDef const *prop) { return prop->IsRequired(); });
      if (!requiredProperties.empty()) {
        auto required_string(Indent(3) + "\"required\" : [");
        for (auto req_prop = requiredProperties.cbegin();
             req_prop != requiredProperties.cend(); ++req_prop) {
          required_string.append("\"" + (*req_prop)->name + "\"");
          if (*req_prop != requiredProperties.back()) {
            required_string.append(", ");
          }
        }
        required_string.append("],");
        code_ += required_string + NewLine();
      }
      code_ += Indent(3) + "\"additionalProperties\" : false" + NewLine();
      auto closeType(Indent(2) + "}");
      if (*s != parser_.structs_.vec.back()) { closeType.append(","); }
      code_ += closeType + NewLine();  // close type
    }
    code_ += Indent(1) + "}," + NewLine();  // close definitions

    // mark root type
    code_ += Indent(1) + "\"$ref\" : \"#/definitions/" +
             GenFullName(parser_.root_struct_def_) + "\"" + NewLine();

    code_ += "}" + NewLine();  // close schema root
    return true;
  }